

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O3

void __thiscall cppnet::Dispatcher::Listen(Dispatcher *this,uint64_t sock,string *ip,uint16_t port)

{
  pointer pcVar1;
  pthread_t pVar2;
  _func_void *p_Var3;
  anon_class_56_4_e8c7a8e2 task;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  size_type local_48;
  char local_40 [16];
  uint16_t local_30;
  undefined6 uStack_2e;
  Dispatcher *pDStack_28;
  
  pcVar1 = (ip->_M_dataplus)._M_p;
  local_58 = (undefined1  [8])sock;
  local_50._M_p = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + ip->_M_string_length);
  local_30 = port;
  pDStack_28 = this;
  pVar2 = pthread_self();
  if (pVar2 == (this->_local_thread_id)._M_thread) {
    Listen::anon_class_56_4_e8c7a8e2::operator()((anon_class_56_4_e8c7a8e2 *)local_58);
  }
  else {
    local_68 = (code *)0x0;
    pcStack_60 = (code *)0x0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    p_Var3 = (_func_void *)operator_new(0x38);
    *(undefined1 (*) [8])p_Var3 = local_58;
    *(_func_void **)(p_Var3 + 8) = p_Var3 + 0x18;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(p_Var3 + 8),local_50._M_p,local_50._M_p + local_48);
    *(uint64_t *)(p_Var3 + 0x28) = CONCAT62(uStack_2e,local_30);
    *(Dispatcher **)(p_Var3 + 0x30) = pDStack_28;
    pcStack_60 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/dispatcher.cpp:87:17)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/dispatcher.cpp:87:17)>
               ::_M_manager;
    local_78._M_unused._M_function_pointer = p_Var3;
    PostTask(this,(Task *)&local_78);
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
  }
  if (local_50._M_p != local_40) {
    operator_delete(local_50._M_p);
  }
  return;
}

Assistant:

void Dispatcher::Listen(uint64_t sock, const std::string& ip, uint16_t port) {
    auto task = [sock, ip, port, this]() {
        auto connect_sock = MakeConnectSocket();
        connect_sock->SetEventActions(_event_actions);
        connect_sock->SetCppNetBase(_cppnet_base.lock());
        connect_sock->SetSocket(sock);
        connect_sock->SetDispatcher(shared_from_this());

        connect_sock->Bind(ip, port);
        connect_sock->Listen();
    };

    if (std::this_thread::get_id() == _local_thread_id) {
        task();

    } else {
        PostTask(task);
    }
}